

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMf.c
# Opt level: O2

void Mf_ManPrintQuit(Mf_Man_t *p,Gia_Man_t *pNew)

{
  int iVar1;
  uint uVar2;
  Vec_Mem_t *pVVar3;
  float fVar4;
  float fVar5;
  abctime aVar6;
  abctime time;
  Gia_Man_t *pStr;
  int i;
  ulong uVar7;
  double dVar8;
  double dVar9;
  float fVar10;
  float fVar11;
  
  pStr = pNew;
  dVar8 = Gia_ManMemory(p->pGia);
  pVVar3 = p->vTtMem;
  fVar11 = 0.0;
  fVar10 = 0.0;
  if (pVVar3 != (Vec_Mem_t *)0x0) {
    fVar10 = ((float)pVVar3->nPageAlloc * 8.0 +
              (float)(pVVar3->iPage + 1) *
              (float)(1 << ((byte)pVVar3->LogPageSze & 0x1f)) * (float)pVVar3->nEntrySize * 8.0 +
             48.0) * 9.536743e-07;
  }
  if (pNew->vMapping != (Vec_Int_t *)0x0) {
    fVar11 = ((float)pNew->vMapping->nCap * 4.0 + 16.0) * 9.536743e-07;
  }
  iVar1 = p->pGia->nObjs;
  dVar9 = p->CutCount[0];
  if ((dVar9 == 0.0) && (!NAN(dVar9))) {
    p->CutCount[0] = 1.0;
    dVar9 = 1.0;
  }
  if (p->pPars->fVerbose != 0) {
    fVar4 = (float)iVar1 * 16.0 * 9.536743e-07;
    fVar5 = (float)(p->vPages).nSize * 262144.0 * 9.536743e-07;
    printf("CutPair = %.0f  ",dVar9);
    printf("Merge = %.0f (%.2f %%)  ",p->CutCount[1],(p->CutCount[1] * 100.0) / p->CutCount[0]);
    printf("Eval = %.0f (%.2f %%)  ",p->CutCount[2],(p->CutCount[2] * 100.0) / p->CutCount[0]);
    printf("Cut = %.0f (%.2f %%)  ",p->CutCount[3],(p->CutCount[3] * 100.0) / p->CutCount[0]);
    putchar(10);
    printf("Gia = %.2f MB  ",(double)(float)(dVar8 * 9.5367431640625e-07));
    printf("Man = %.2f MB  ",(double)fVar4);
    printf("Cut = %.2f MB   ",(double)fVar5);
    printf("Map = %.2f MB  ",(double)fVar11);
    printf("TT = %.2f MB  ",(double)fVar10);
    printf("Total = %.2f MB",
           (double)((float)(dVar8 * 9.5367431640625e-07) + fVar4 + fVar5 + fVar11 + fVar10));
    putchar(10);
    for (uVar7 = 0; (long)uVar7 <= (long)p->pPars->nLutSize; uVar7 = uVar7 + 1) {
      pStr = (Gia_Man_t *)(uVar7 & 0xffffffff);
      printf("%d = %d  ",pStr,(ulong)(uint)p->nCutCounts[uVar7]);
    }
    if (p->vTtMem != (Vec_Mem_t *)0x0) {
      uVar2 = p->vTtMem->nEntries;
      pStr = (Gia_Man_t *)(ulong)uVar2;
      printf("TT = %d (%.2f %%)  ",((double)(int)uVar2 * 100.0) / p->CutCount[2]);
    }
    aVar6 = Abc_Clock();
    Abc_PrintTime((int)aVar6 - (int)p->clkStart,(char *)pStr,time);
    fflush(_stdout);
    return;
  }
  return;
}

Assistant:

void Mf_ManPrintQuit( Mf_Man_t * p, Gia_Man_t * pNew )
{
    float MemGia   = Gia_ManMemory(p->pGia) / (1<<20);
    float MemMan   = 1.0 * sizeof(Mf_Obj_t) * Gia_ManObjNum(p->pGia) / (1<<20);
    float MemCuts  = 1.0 * sizeof(int) * (1 << 16) * Vec_PtrSize(&p->vPages) / (1<<20);
    float MemTt    = p->vTtMem ? Vec_MemMemory(p->vTtMem) / (1<<20) : 0;
    float MemMap   = Vec_IntMemory(pNew->vMapping) / (1<<20);
    if ( p->CutCount[0] == 0 )
        p->CutCount[0] = 1;
    if ( !p->pPars->fVerbose )
        return;
    printf( "CutPair = %.0f  ",         p->CutCount[0] );
    printf( "Merge = %.0f (%.2f %%)  ", p->CutCount[1], 100.0*p->CutCount[1]/p->CutCount[0] );
    printf( "Eval = %.0f (%.2f %%)  ",  p->CutCount[2], 100.0*p->CutCount[2]/p->CutCount[0] );
    printf( "Cut = %.0f (%.2f %%)  ",   p->CutCount[3], 100.0*p->CutCount[3]/p->CutCount[0] );
    printf( "\n" );
    printf( "Gia = %.2f MB  ",          MemGia );
    printf( "Man = %.2f MB  ",          MemMan ); 
    printf( "Cut = %.2f MB   ",         MemCuts );
    printf( "Map = %.2f MB  ",          MemMap ); 
    printf( "TT = %.2f MB  ",           MemTt ); 
    printf( "Total = %.2f MB",          MemGia + MemMan + MemCuts + MemMap + MemTt ); 
    printf( "\n" );
    if ( 1 )
    {
        int i;
        for ( i = 0; i <= p->pPars->nLutSize; i++ )
            printf( "%d = %d  ", i, p->nCutCounts[i] );
        if ( p->vTtMem )
            printf( "TT = %d (%.2f %%)  ", Vec_MemEntryNum(p->vTtMem), 100.0 * Vec_MemEntryNum(p->vTtMem) / p->CutCount[2] );
        Abc_PrintTime( 1, "Time",    Abc_Clock() - p->clkStart );
    }
    fflush( stdout );
}